

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codec.cpp
# Opt level: O0

void anon_unknown.dwarf_208b::DecodeOneFrame
               (double *coded_spectral_envelope,double *frequency_axis,int fft_size,double *mel_axis
               ,fft_complex *weight,int max_dimension,int number_of_dimensions,
               InverseComplexFFT *inverse_complex_fft,double *spectral_envelope)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  double *y;
  double dVar3;
  int local_44;
  int i;
  double *mel_spectrum;
  int max_dimension_local;
  fft_complex *weight_local;
  double *mel_axis_local;
  int fft_size_local;
  double *frequency_axis_local;
  double *coded_spectral_envelope_local;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)(max_dimension + 2);
  uVar2 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar2 = 0xffffffffffffffff;
  }
  y = (double *)operator_new__(uVar2);
  IDCTForCodec(coded_spectral_envelope,max_dimension,weight,inverse_complex_fft,number_of_dimensions
               ,y + 1);
  *y = y[1];
  y[max_dimension + 1] = y[max_dimension];
  interp1(mel_axis,y,max_dimension + 2,frequency_axis,fft_size / 2 + 1,spectral_envelope);
  for (local_44 = 0; local_44 < fft_size / 2 + 1; local_44 = local_44 + 1) {
    dVar3 = exp(spectral_envelope[local_44] / (double)max_dimension);
    spectral_envelope[local_44] = dVar3;
  }
  if (y != (double *)0x0) {
    operator_delete__(y);
  }
  return;
}

Assistant:

static void DecodeOneFrame(const double *coded_spectral_envelope,
    const double *frequency_axis, int fft_size, const double *mel_axis,
    const fft_complex *weight, int max_dimension, int number_of_dimensions,
    const InverseComplexFFT *inverse_complex_fft, double *spectral_envelope) {
  double *mel_spectrum = new double[max_dimension + 2];

  // IDCT
  IDCTForCodec(coded_spectral_envelope, max_dimension, weight,
      inverse_complex_fft, number_of_dimensions, &mel_spectrum[1]);
  mel_spectrum[0] = mel_spectrum[1];
  mel_spectrum[max_dimension + 1] = mel_spectrum[max_dimension];

  interp1(mel_axis, mel_spectrum, max_dimension + 2, frequency_axis,
      fft_size / 2 + 1, spectral_envelope);

  for (int i = 0; i < fft_size / 2 + 1; ++i)
    spectral_envelope[i] = exp(spectral_envelope[i] / max_dimension);

  delete[] mel_spectrum;
}